

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O1

void __thiscall QStyle::QStyle(QStyle *this)

{
  QObjectPrivate *this_00;
  
  this_00 = (QObjectPrivate *)operator_new(0x98);
  QObjectPrivate::QObjectPrivate(this_00,QObjectPrivateVersion);
  *(undefined ***)this_00 = &PTR__QStylePrivate_007f7690;
  *(undefined8 *)(this_00 + 0x80) = 0;
  *(undefined8 *)(this_00 + 0x88) = 0;
  *(undefined8 *)(this_00 + 0x90) = 0;
  QObject::QObject(&this->super_QObject,this_00,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_007f7a60;
  *(QStyle **)(*(long *)&this->field_0x8 + 0x78) = this;
  return;
}

Assistant:

QStyle::QStyle()
    : QObject(*new QStylePrivate)
{
    Q_D(QStyle);
    d->proxyStyle = this;
}